

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

UnaryExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::UnaryExpression,slang::ast::UnaryOperator,slang::ast::Type_const&,slang::ast::Expression&,slang::SourceRange,slang::SourceRange>
          (BumpAllocator *this,UnaryOperator *args,Type *args_1,Expression *args_2,
          SourceRange *args_3,SourceRange *args_4)

{
  SourceRange sourceRange;
  SourceRange opRange;
  UnaryExpression *pUVar1;
  SourceLocation in_RCX;
  SourceLocation in_RSI;
  SourceLocation in_RDI;
  SourceLocation in_R8;
  UnaryExpression *in_R9;
  size_t in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  BumpAllocator *in_stack_ffffffffffffffb8;
  
  pUVar1 = (UnaryExpression *)
           allocate(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  sourceRange.endLoc = in_RCX;
  sourceRange.startLoc = in_R8;
  opRange.endLoc = in_RDI;
  opRange.startLoc = in_RSI;
  ast::UnaryExpression::UnaryExpression
            (in_R9,(UnaryOperator)((ulong)*(undefined8 *)((long)in_R8 + 8) >> 0x20),*(Type **)in_R8,
             (Expression *)(in_R9->super_Expression).type.ptr,sourceRange,opRange);
  return pUVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }